

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_impl.cpp
# Opt level: O0

MPP_RET enc_impl_start(EncImpl impl,HalEncTask *task)

{
  EncImplCtx *p;
  MPP_RET ret;
  HalEncTask *task_local;
  EncImpl impl_local;
  
  if (impl == (EncImpl)0x0) {
    _mpp_log_l(2,"enc_impl","found NULL input\n","enc_impl_start");
    impl_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    p._4_4_ = MPP_OK;
    if (*(long *)(*(long *)((long)impl + 0x18) + 0x38) != 0) {
      p._4_4_ = (**(code **)(*(long *)((long)impl + 0x18) + 0x38))
                          (*(undefined8 *)((long)impl + 0x20),task);
    }
    impl_local._4_4_ = p._4_4_;
  }
  return impl_local._4_4_;
}

Assistant:

MPP_RET enc_impl_start(EncImpl impl, HalEncTask *task)
{
    if (NULL == impl) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MPP_RET ret = MPP_OK;
    EncImplCtx *p = (EncImplCtx *)impl;
    if (p->api->start)
        ret = p->api->start(p->ctx, task);

    return ret;
}